

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerInvulnerable::InitEffect(APowerInvulnerable *this)

{
  DWORD *pDVar1;
  ActorFlags2 *pAVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  undefined4 extraout_var_00;
  DObject *pDVar6;
  AActor *pAVar7;
  bool bVar8;
  
  pDVar1 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->effects;
  *pDVar1 = *pDVar1 & 0xffffffdf;
  pAVar2 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
  pAVar2->Value = pAVar2->Value | 0x8000000;
  if ((this->super_APowerup).Mode.super_FName.Index == 0) {
    pDVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.o;
    if ((pDVar6 != (DObject *)0x0) && ((pDVar6->ObjectFlags & 0x20) != 0)) {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
      pDVar6 = (DObject *)0x0;
    }
    pPVar3 = APlayerPawn::RegistrationInfo.MyClass;
    if (pDVar6->Class == (PClass *)0x0) {
      iVar4 = (**pDVar6->_vptr_DObject)(pDVar6);
      pDVar6->Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar5 = pDVar6->Class;
    bVar8 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar8) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (bVar8) {
      pAVar7 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
      if ((pAVar7 != (AActor *)0x0) &&
         (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
        pAVar7 = (AActor *)0x0;
      }
      if ((pAVar7->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
        (pAVar7->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      (this->super_APowerup).Mode.super_FName.Index =
           *(int *)&(pAVar7->super_DThinker).super_DObject.Class[2].super_PNativeStruct.
                    super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.Symbols.
                    Nodes;
    }
  }
  if ((this->super_APowerup).Mode.super_FName.Index == 0x12) {
    pAVar2 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
    pAVar2->Value = pAVar2->Value | 0x80000000;
  }
  return;
}

Assistant:

void APowerInvulnerable::InitEffect ()
{
	Super::InitEffect();
	Owner->effects &= ~FX_RESPAWNINVUL;
	Owner->flags2 |= MF2_INVULNERABLE;
	if (Mode == NAME_None && Owner->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Mode = static_cast<PClassPlayerPawn *>(Owner->GetClass())->InvulMode;
	}
	if (Mode == NAME_Reflective)
	{
		Owner->flags2 |= MF2_REFLECTIVE;
	}
}